

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::CheckAndSetOutParamMaxDepth(FunctionBody *this,RegSlot cOutParamsDepth)

{
  RegSlot cOutParamsDepth_local;
  FunctionBody *this_local;
  
  CheckNotExecuting(this);
  SetOutParamMaxDepth(this,cOutParamsDepth);
  return;
}

Assistant:

void
    FunctionBody::CheckAndSetOutParamMaxDepth(RegSlot cOutParamsDepth)
    {
        CheckNotExecuting();
        SetOutParamMaxDepth(cOutParamsDepth);
    }